

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O3

vector<WorldPath_*,_std::allocator<WorldPath_*>_> * __thiscall
WorldShuffler::build_weighted_blocked_paths_list
          (vector<WorldPath_*,_std::allocator<WorldPath_*>_> *__return_storage_ptr__,
          WorldShuffler *this)

{
  undefined1 uVar1;
  Item *pIVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  void *pvVar5;
  void *pvVar6;
  pointer ppIVar7;
  _Base_ptr p_Var8;
  undefined1 uVar9;
  mapped_type_conflict2 *pmVar10;
  _Rb_tree_node_base *p_Var11;
  Json *this_00;
  reference this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _Rb_tree_node_base *p_Var14;
  uint uVar15;
  _Rb_tree_node_base *p_Var16;
  pointer ppWVar17;
  WorldSolver *pWVar18;
  pointer ppIVar19;
  WorldPath *path;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  quantities_to_place;
  vector<Item_*,_std::allocator<Item_*>_> items_to_place;
  WorldPath *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  WorldShuffler *local_d8;
  WorldSolver *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  void *local_a8;
  _Rb_tree_node_base local_a0;
  size_t local_80;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> local_78;
  vector<Item_*,_std::allocator<Item_*>_> local_60;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *local_48;
  pointer local_40;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  *local_38;
  
  local_78.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppWVar17 = (this->_solver)._blocked_paths.
             super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (this->_solver)._blocked_paths.
             super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_d8 = this;
  local_48 = __return_storage_ptr__;
  if (ppWVar17 != local_40) {
    pWVar18 = &this->_solver;
    local_38 = &this->_item_pool_quantities;
    local_d0 = pWVar18;
    do {
      local_100 = *ppWVar17;
      WorldSolver::missing_nodes_to_take_path
                ((vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_a8,pWVar18,local_100);
      pvVar6 = local_a8;
      pvVar5 = (void *)CONCAT44(local_a0._4_4_,local_a0._M_color);
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8,(long)local_a0._M_parent - (long)local_a8);
      }
      if (pvVar6 == pvVar5) {
        WorldSolver::missing_items_to_take_path(&local_60,pWVar18,local_100);
        ppIVar7 = local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_a0._M_color = _S_red;
        local_a0._M_parent = (_Rb_tree_node_base *)0x0;
        local_a0._M_left = &local_a0;
        local_80 = 0;
        ppIVar19 = local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_a0._M_right = local_a0._M_left;
        if (local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            pIVar2 = *ppIVar19;
            uVar9 = pIVar2->_id;
            if (local_a0._M_parent == (_Rb_tree_node_base *)0x0) {
LAB_00199791:
              local_f8._M_dataplus._M_p._0_1_ = uVar9;
              pmVar10 = std::
                        map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                        ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                                      *)&local_a8,(key_type_conflict *)&local_f8);
              *pmVar10 = 0;
              uVar9 = pIVar2->_id;
            }
            else {
              p_Var8 = local_a0._M_parent;
              p_Var11 = &local_a0;
              do {
                p_Var16 = p_Var11;
                p_Var14 = p_Var8;
                uVar1 = (undefined1)p_Var14[1]._M_color;
                p_Var11 = p_Var14;
                if ((byte)uVar1 < (byte)uVar9) {
                  p_Var11 = p_Var16;
                }
                p_Var8 = (&p_Var14->_M_left)[(byte)uVar1 < (byte)uVar9];
              } while ((&p_Var14->_M_left)[(byte)uVar1 < (byte)uVar9] != (_Base_ptr)0x0);
              if (p_Var11 == &local_a0) goto LAB_00199791;
              if ((byte)uVar1 < (byte)uVar9) {
                p_Var14 = p_Var16;
              }
              if ((byte)uVar9 < (byte)(char)p_Var14[1]._M_color) goto LAB_00199791;
            }
            local_f8._M_dataplus._M_p._0_1_ = uVar9;
            pmVar10 = std::
                      map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                      ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                                    *)&local_a8,(key_type_conflict *)&local_f8);
            *pmVar10 = *pmVar10 + 1;
            ppIVar19 = ppIVar19 + 1;
            p_Var11 = local_a0._M_left;
          } while (ppIVar19 != ppIVar7);
          for (; p_Var11 != &local_a0;
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
            pmVar10 = std::
                      map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                      ::operator[](local_38,(key_type_conflict *)(p_Var11 + 1));
            if (*pmVar10 < (ushort)*(undefined2 *)((long)&p_Var11[1]._M_color + 2))
            goto LAB_0019992a;
          }
        }
        pWVar18 = local_d0;
        if (local_100->_weight != 0) {
          uVar15 = 0;
          do {
            std::vector<WorldPath*,std::allocator<WorldPath*>>::emplace_back<WorldPath*&>
                      ((vector<WorldPath*,std::allocator<WorldPath*>> *)&local_78,&local_100);
            uVar15 = uVar15 + 1;
          } while (uVar15 < local_100->_weight);
        }
        this_00 = WorldSolver::debug_log_for_current_step_abi_cxx11_(pWVar18);
        this_01 = nlohmann::
                  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)this_00,"blockedPaths");
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar3 = (local_100->_from_node->_id)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar3,pcVar3 + (local_100->_from_node->_id)._M_string_length
                  );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_c8," --> ");
        pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_c8,(local_100->_to_node->_id)._M_dataplus._M_p,
                            (local_100->_to_node->_id)._M_string_length);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar12->_M_dataplus)._M_p;
        paVar13 = &pbVar12->field_2;
        if (paVar4 == paVar13) {
          local_f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
        }
        else {
          local_f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_f8._M_dataplus._M_p = (pointer)paVar4;
        }
        local_f8._M_string_length = pbVar12->_M_string_length;
        (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
        pbVar12->_M_string_length = 0;
        (pbVar12->field_2)._M_local_buf[0] = '\0';
        nlohmann::
        basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::emplace_back<std::__cxx11::string>
                  ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)this_01,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
LAB_0019992a:
        std::
        _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_short>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_short>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_short>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_short>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                     *)&local_a8);
        pWVar18 = local_d0;
        if (local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                                .super__Vector_impl_data._M_start);
          pWVar18 = local_d0;
        }
      }
      ppWVar17 = ppWVar17 + 1;
    } while (ppWVar17 != local_40);
  }
  vectools::shuffle<WorldPath*>(&local_78,&local_d8->_rng);
  (local_48->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (local_48->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (local_48->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return local_48;
}

Assistant:

std::vector<WorldPath*> WorldShuffler::build_weighted_blocked_paths_list()
{
    const std::vector<WorldPath*>& blocked_paths = _solver.blocked_paths();
    std::vector<WorldPath*> weighted_blocked_paths;

    for (WorldPath* path : blocked_paths)
    {
        // If items are not the (only) blocking point for taking this path, let it go
        if(!_solver.missing_nodes_to_take_path(path).empty())
            continue;

        // If all items cannot be placed since the item pool is running out of that item type,
        // do not try to open this path. It will open by itself once the item (as placed inside plando)
        // will be reached.
        std::vector<Item*> items_to_place = _solver.missing_items_to_take_path(path);
        std::map<uint8_t, uint16_t> quantities_to_place;
        for(Item* item : items_to_place)
        {
            if(!quantities_to_place.count(item->id()))
                quantities_to_place[item->id()] = 0;
            quantities_to_place[item->id()] += 1;
        }

        bool can_place_all_items = true;
        for(auto& [item_id, quantity_to_place] : quantities_to_place)
        {
            if(_item_pool_quantities[item_id] < quantity_to_place)
            {
                can_place_all_items = false;
                break;
            }
        }

        if(can_place_all_items)
        {
            for(int i=0 ; i<path->weight() ; ++i)
                weighted_blocked_paths.emplace_back(path);

            // All conditions are met, add this path to the weighted blocked paths list
            Json& debug_log = _solver.debug_log_for_current_step();
            debug_log["blockedPaths"].emplace_back(path->origin()->id() + " --> " + path->destination()->id());
        }
    }

    vectools::shuffle(weighted_blocked_paths, _rng);
    return std::move(weighted_blocked_paths);
}